

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcWindow::IfcWindow(IfcWindow *this)

{
  IfcWindow *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcWindow");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__01030ef0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>,
             &PTR_construction_vtable_24__01031028);
  *(undefined8 *)this = 0x1030dc0;
  *(undefined8 *)&this->field_0x178 = 0x1030ed8;
  *(undefined8 *)&this->field_0x88 = 0x1030de8;
  *(undefined8 *)&this->field_0x98 = 0x1030e10;
  *(undefined8 *)&this->field_0xd0 = 0x1030e38;
  *(undefined8 *)&this->field_0x100 = 0x1030e60;
  *(undefined8 *)&this->field_0x138 = 0x1030e88;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x1030eb0;
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x10);
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x20);
  return;
}

Assistant:

IfcWindow() : Object("IfcWindow") {}